

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool get_by_hash(storage *st,string *hash)

{
  undefined1 uVar1;
  undefined1 local_88 [8];
  block b;
  bool ok;
  
  b.sha256.field_2._M_local_buf[0xf] = '\0';
  storage::get((block *)local_88,st,(bool *)(b.sha256.field_2._M_local_buf + 0xf),hash);
  uVar1 = b.sha256.field_2._M_local_buf[0xf];
  if (b.sha256.field_2._M_local_buf[0xf] == '\x01') {
    dump((ostream *)&std::cout,(block *)local_88);
  }
  block::~block((block *)local_88);
  return (bool)uVar1;
}

Assistant:

bool get_by_hash(storage &st, const std::string &hash) {
    bool ok{};
    block b = st.get(&ok, hash);
    if ( !ok ) {
        return ok;
    }

    dump(std::cout, b);

    return true;
}